

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O1

bool draco::DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<4>>
               (uint32_t num_values,DecoderBuffer *src_buffer,uint32_t *out_values)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  RAnsSymbolDecoder<4> decoder;
  RAnsSymbolDecoder<4> local_98;
  
  local_98.ans_.ans_.buf = (uint8_t *)0x0;
  local_98.ans_.ans_.buf_offset = 0;
  local_98.ans_.ans_.state = 0;
  local_98.ans_.probability_table_.
  super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.ans_.probability_table_.
  super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.ans_.probability_table_.
  super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_98.num_symbols_ = 0;
  bVar1 = RAnsSymbolDecoder<4>::Create(&local_98,src_buffer);
  if ((bVar1) &&
     (((num_values == 0 || (local_98.num_symbols_ != 0)) &&
      (bVar1 = RAnsSymbolDecoder<4>::StartDecoding(&local_98,src_buffer), bVar1)))) {
    bVar1 = true;
    if (num_values != 0) {
      uVar3 = 0;
      do {
        uVar2 = RAnsSymbolDecoder<4>::DecodeSymbol(&local_98);
        out_values[uVar3] = uVar2;
        uVar3 = uVar3 + 1;
      } while (num_values != uVar3);
    }
  }
  else {
    bVar1 = false;
  }
  if (local_98.ans_.probability_table_.
      super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.ans_.probability_table_.
                    super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.ans_.probability_table_.
                          super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.ans_.probability_table_.
                          super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.ans_.lut_table_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.ans_.lut_table_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.ans_.lut_table_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.probability_table_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_98.probability_table_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_98.probability_table_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_98.probability_table_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool DecodeRawSymbolsInternal(uint32_t num_values, DecoderBuffer *src_buffer,
                              uint32_t *out_values) {
  SymbolDecoderT decoder;
  if (!decoder.Create(src_buffer)) {
    return false;
  }

  if (num_values > 0 && decoder.num_symbols() == 0) {
    return false;  // Wrong number of symbols.
  }

  if (!decoder.StartDecoding(src_buffer)) {
    return false;
  }
  for (uint32_t i = 0; i < num_values; ++i) {
    // Decode a symbol into the value.
    const uint32_t value = decoder.DecodeSymbol();
    out_values[i] = value;
  }
  decoder.EndDecoding();
  return true;
}